

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::writeBasisFile(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,char *filename,NameSet *rowNames,NameSet *colNames,bool cpxFormat)

{
  VarStatus VVar1;
  bool bVar2;
  size_t sVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  undefined7 in_register_00000081;
  long lVar8;
  NameSet *pNVar9;
  ofstream file;
  undefined1 auStack_268 [8];
  NameSet *local_260;
  int local_254;
  int local_250;
  undefined4 local_24c;
  NameSet *local_248;
  long local_240;
  long local_238;
  long local_230;
  filebuf local_228 [8];
  undefined8 uStack_220;
  byte abStack_218 [8];
  int aiStack_210 [54];
  ios_base local_138 [264];
  
  if (this->_isRealLPLoaded == true) {
    bVar2 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::writeBasisFile(&this->_solver,filename,rowNames,colNames,cpxFormat);
    return bVar2;
  }
  local_24c = (undefined4)CONCAT71(in_register_00000081,cpxFormat);
  local_260 = rowNames;
  std::ofstream::ofstream(&local_230,filename,_S_out);
  iVar5 = *(int *)((long)aiStack_210 + *(long *)(local_230 + -0x18));
  if (iVar5 == 0) {
    abStack_218[*(long *)(local_230 + -0x18)] = abStack_218[*(long *)(local_230 + -0x18)] | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"NAME  ",6);
    if (filename == (char *)0x0) {
      std::ios::clear((int)auStack_268 + (int)*(undefined8 *)(local_230 + -0x18) + 0x38);
    }
    else {
      sVar3 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,filename,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
    if (this->_hasBasis == false) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"ENDATA\n",7);
    }
    else {
      local_238 = (long)(this->_basisStatusCols).thesize;
      local_250 = iVar5;
      if (0 < local_238) {
        local_254 = (this->_basisStatusRows).thesize;
        local_240 = (long)local_254;
        lVar8 = 0;
        iVar5 = 0;
        pNVar9 = local_260;
        local_248 = colNames;
        do {
          VVar1 = (this->_basisStatusCols).data[lVar8];
          if (VVar1 == ON_UPPER) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," UL ",4);
            *(undefined8 *)((long)&uStack_220 + *(long *)(local_230 + -0x18)) = 8;
            if ((colNames == (NameSet *)0x0) || ((colNames->set).thenum <= lVar8)) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"x",1);
              std::ostream::operator<<((ostream *)&local_230,(int)lVar8);
            }
            else if (colNames->mem == (char *)0x0) {
              std::ios::clear((int)auStack_268 + (int)*(undefined8 *)(local_230 + -0x18) + 0x38);
              pNVar9 = local_260;
            }
            else {
              pcVar7 = colNames->mem +
                       (colNames->set).theitem[(colNames->set).thekey[lVar8].idx].data;
              sVar3 = strlen(pcVar7);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar7,sVar3)
              ;
              pNVar9 = local_260;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
          }
          else if (VVar1 == BASIC) {
            iVar6 = iVar5;
            if (iVar5 < local_254) {
              lVar4 = 0;
              do {
                if ((this->_basisStatusRows).data[iVar5 + lVar4] != BASIC) {
                  iVar6 = iVar5 + (int)lVar4;
                  break;
                }
                lVar4 = lVar4 + 1;
                iVar6 = local_254;
              } while (local_240 - iVar5 != lVar4);
            }
            pcVar7 = " XL ";
            if (((this->_basisStatusRows).data[iVar6] == ON_UPPER) &&
               (((char)local_24c == '\0' ||
                (pcVar7 = " XL ", (this->_rowTypes).data[iVar6] == RANGETYPE_BOXED)))) {
              pcVar7 = " XU ";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar7,4);
            *(undefined8 *)((long)&uStack_220 + *(long *)(local_230 + -0x18)) = 8;
            if ((colNames == (NameSet *)0x0) || ((colNames->set).thenum <= lVar8)) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"x",1);
              std::ostream::operator<<((ostream *)&local_230,(int)lVar8);
            }
            else if (colNames->mem == (char *)0x0) {
              std::ios::clear((int)auStack_268 + (int)*(undefined8 *)(local_230 + -0x18) + 0x38);
              pNVar9 = local_260;
            }
            else {
              pcVar7 = colNames->mem +
                       (colNames->set).theitem[(colNames->set).thekey[lVar8].idx].data;
              sVar3 = strlen(pcVar7);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar7,sVar3)
              ;
              pNVar9 = local_260;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"       ",7);
            if (((pNVar9 == (NameSet *)0x0) || (iVar6 < 0)) || ((pNVar9->set).thenum <= iVar6)) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"C",1);
              std::ostream::operator<<((ostream *)&local_230,iVar6);
            }
            else if (pNVar9->mem == (char *)0x0) {
              std::ios::clear((int)auStack_268 + (int)*(undefined8 *)(local_230 + -0x18) + 0x38);
              colNames = local_248;
            }
            else {
              pcVar7 = pNVar9->mem + (pNVar9->set).theitem[(pNVar9->set).thekey[iVar6].idx].data;
              sVar3 = strlen(pcVar7);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar7,sVar3)
              ;
              colNames = local_248;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
            iVar5 = iVar6 + 1;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != local_238);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"ENDATA\n",7);
      iVar5 = local_250;
    }
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return iVar5 == 0;
}

Assistant:

bool SoPlexBase<R>::writeBasisFile(const char* filename, const NameSet* rowNames,
                                   const NameSet* colNames, const bool cpxFormat) const
{
   assert(filename != nullptr);

   if(_isRealLPLoaded)
      return _solver.writeBasisFile(filename, rowNames, colNames, cpxFormat);
   else
   {
      std::ofstream file(filename);

      if(!file.good())
         return false;

      file.setf(std::ios::left);
      file << "NAME  " << filename << "\n";

      // do not write basis if there is none
      if(!_hasBasis)
      {
         file << "ENDATA\n";
         return true;
      }

      // start writing
      int numRows = _basisStatusRows.size();
      int numCols = _basisStatusCols.size();
      int row = 0;

      for(int col = 0; col < numCols; col++)
      {
         assert(_basisStatusCols[col] != SPxSolverBase<R>::UNDEFINED);

         if(_basisStatusCols[col] == SPxSolverBase<R>::BASIC)
         {
            // find nonbasic row
            for(; row < numRows; row++)
            {
               assert(_basisStatusRows[row] != SPxSolverBase<R>::UNDEFINED);

               if(_basisStatusRows[row] != SPxSolverBase<R>::BASIC)
                  break;
            }

            assert(row != numRows);

            if(_basisStatusRows[row] == SPxSolverBase<R>::ON_UPPER && (!cpxFormat
                  || _rowTypes[row] == SoPlexBase<R>::RANGETYPE_BOXED))
               file << " XU ";
            else
               file << " XL ";

            file << std::setw(8);

            if(colNames != nullptr && colNames->has(col))
               file << (*colNames)[col];
            else
               file << "x" << col;

            file << "       ";

            if(rowNames != nullptr && rowNames->has(row))
               file << (*rowNames)[row];
            else
               file << "C" << row;

            file << "\n";
            row++;
         }
         else
         {
            if(_basisStatusCols[col] == SPxSolverBase<R>::ON_UPPER)
            {
               file << " UL ";

               file << std::setw(8);

               if(colNames != nullptr && colNames->has(col))
                  file << (*colNames)[col];
               else
                  file << "x" << col;

               file << "\n";
            }
         }
      }

      file << "ENDATA\n";

#ifndef NDEBUG

      // check that the remaining rows are basic
      for(; row < numRows; row++)
      {
         assert(_basisStatusRows[row] == SPxSolverBase<R>::BASIC);
      }

#endif

      return true;
   }
}